

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O3

void __thiscall CoreReadTask::execute(CoreReadTask *this)

{
  char cVar1;
  int iVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t chunk;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  long local_1e8;
  short local_1e0;
  
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  iVar2 = exr_read_scanline_chunk_info(this->_f,0,this->_y);
  if (iVar2 == 0) {
    iVar2 = exr_decoding_initialize(this->_f,0,&local_228,&local_1e8);
    if (iVar2 == 0) {
      if (0 < (long)local_1e0) {
        puVar3 = this->_ptr;
        lVar5 = 0;
        iVar2 = 0;
        do {
          iVar2 = iVar2 + *(char *)(local_1e8 + 0x19 + lVar5);
          lVar5 = lVar5 + 0x30;
        } while ((long)local_1e0 * 0x30 != lVar5);
        if (0 < local_1e0) {
          lVar5 = 0;
          lVar4 = 0;
          do {
            *(uint8_t **)(local_1e8 + 0x28 + lVar5) = puVar3;
            *(int *)(local_1e8 + 0x20 + lVar5) = iVar2;
            *(int *)(local_1e8 + 0x24 + lVar5) = *(int *)(local_1e8 + 0xc + lVar5) * iVar2;
            cVar1 = *(char *)(local_1e8 + 0x19 + lVar5);
            *(short *)(local_1e8 + 0x1c + lVar5) = (short)cVar1;
            puVar3 = puVar3 + cVar1;
            lVar4 = lVar4 + 1;
            lVar5 = lVar5 + 0x30;
          } while (lVar4 < local_1e0);
        }
      }
      iVar2 = exr_decoding_choose_default_routines(this->_f,0,&local_1e8);
      if (iVar2 == 0) {
        exr_decoding_run(this->_f,0,&local_1e8);
      }
    }
  }
  exr_decoding_destroy(this->_f,&local_1e8);
  return;
}

Assistant:

void execute () override
    {
        exr_chunk_info_t      cinfo = {0};
        exr_decode_pipeline_t chunk;
        exr_result_t rv = exr_read_scanline_chunk_info (_f, 0, _y, &cinfo);
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_decoding_initialize (_f, 0, &cinfo, &chunk);
        if (rv == EXR_ERR_SUCCESS)
        {
            uint8_t* curchanptr    = _ptr;
            int      bytesperpixel = 0;
            for (int c = 0; c < chunk.channel_count; ++c)
                bytesperpixel += chunk.channels[c].bytes_per_element;
            for (int c = 0; c < chunk.channel_count; ++c)
            {
                exr_coding_channel_info_t& outc = chunk.channels[c];
                outc.decode_to_ptr              = curchanptr;
                outc.user_pixel_stride          = bytesperpixel;
                outc.user_line_stride           = outc.width * bytesperpixel;
                outc.user_bytes_per_element =
                    chunk.channels[c].bytes_per_element;
                curchanptr += chunk.channels[c].bytes_per_element;
            }

            rv = exr_decoding_choose_default_routines (_f, 0, &chunk);
        }
        if (rv == EXR_ERR_SUCCESS) rv = exr_decoding_run (_f, 0, &chunk);
        exr_decoding_destroy (_f, &chunk);
    }